

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O2

void __thiscall
t_cpp_generator::generate_service_multiface(t_cpp_generator *this,t_service *tservice)

{
  string *__rhs;
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  t_struct *ptVar3;
  t_function *tfunction;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  pointer pptVar7;
  pointer pptVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string call;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string list_type;
  string local_128;
  string extends;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_multiface;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&extends_multiface);
  std::__cxx11::string::string((string *)&extends_multiface,"",(allocator *)&list_type);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&list_type,this,&tservice->extends_->super_t_type,false,false);
    std::__cxx11::string::operator=((string *)&extends,(string *)&list_type);
    std::__cxx11::string::~string((string *)&list_type);
    std::operator+(&call,", public ",&extends);
    std::operator+(&list_type,&call,"Multiface");
    std::__cxx11::string::operator=((string *)&extends_multiface,(string *)&list_type);
    std::__cxx11::string::~string((string *)&list_type);
    std::__cxx11::string::~string((string *)&call);
  }
  std::__cxx11::string::string
            ((string *)&local_1b0,"std::vector<std::shared_ptr<",(allocator *)&local_168);
  __rhs = &(this->super_t_oop_generator).super_t_generator.service_name_;
  std::operator+(&call,&local_1b0,__rhs);
  std::operator+(&list_type,&call,"If> >");
  std::__cxx11::string::~string((string *)&call);
  std::__cxx11::string::~string((string *)&local_1b0);
  poVar1 = &this->f_header_;
  poVar6 = std::operator<<((ostream *)poVar1,"class ");
  poVar6 = std::operator<<(poVar6,(string *)__rhs);
  poVar6 = std::operator<<(poVar6,"Multiface : ");
  poVar6 = std::operator<<(poVar6,"virtual public ");
  poVar6 = std::operator<<(poVar6,(string *)__rhs);
  poVar6 = std::operator<<(poVar6,"If");
  poVar6 = std::operator<<(poVar6,(string *)&extends_multiface);
  poVar6 = std::operator<<(poVar6," {");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  poVar6 = std::operator<<(poVar6," public:");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
  poVar6 = std::operator<<(poVar6,(string *)__rhs);
  poVar6 = std::operator<<(poVar6,"Multiface(");
  poVar6 = std::operator<<(poVar6,(string *)&list_type);
  poVar6 = std::operator<<(poVar6,"& ifaces) : ifaces_(ifaces) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&call);
  if (extends._M_string_length != 0) {
    t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
    std::operator+(&local_168,"  std::vector<std::shared_ptr<",__rhs);
    std::operator+(&local_1b0,&local_168,"If> >::iterator iter;");
    poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_128);
    poVar6 = std::operator<<(poVar6,"  for (iter = ifaces.begin(); iter != ifaces.end(); ++iter) {")
    ;
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_b0);
    poVar6 = std::operator<<(poVar6,"    ");
    poVar6 = std::operator<<(poVar6,(string *)&extends);
    poVar6 = std::operator<<(poVar6,"Multiface::add(*iter);");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_70);
    poVar6 = std::operator<<(poVar6,"  }");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&call);
  }
  t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
  poVar6 = std::operator<<(poVar6,"}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
  poVar6 = std::operator<<(poVar6,"virtual ~");
  poVar6 = std::operator<<(poVar6,(string *)__rhs);
  poVar6 = std::operator<<(poVar6,"Multiface() {}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&call);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  poVar6 = std::operator<<((ostream *)poVar1," protected:");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
  poVar6 = std::operator<<(poVar6,(string *)&list_type);
  poVar6 = std::operator<<(poVar6," ifaces_;");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
  poVar6 = std::operator<<(poVar6,(string *)__rhs);
  poVar6 = std::operator<<(poVar6,"Multiface() {}");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_168);
  poVar6 = std::operator<<(poVar6,"void add(::std::shared_ptr<");
  poVar6 = std::operator<<(poVar6,(string *)__rhs);
  poVar6 = std::operator<<(poVar6,"If> iface) {");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&call);
  if (extends._M_string_length != 0) {
    t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
    poVar6 = std::operator<<(poVar6,"  ");
    poVar6 = std::operator<<(poVar6,(string *)&extends);
    poVar6 = std::operator<<(poVar6,"Multiface::add(iface);");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&call);
  }
  t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
  poVar6 = std::operator<<(poVar6,"  ifaces_.push_back(iface);");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
  poVar6 = std::operator<<(poVar6,(string *)&local_1b0);
  poVar6 = std::operator<<(poVar6,"}");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&call);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
  poVar6 = std::operator<<(poVar6," public:");
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&call);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  for (pptVar7 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar7 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar7 = pptVar7 + 1) {
    (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])(this,poVar1,*pptVar7)
    ;
    ptVar3 = (*pptVar7)->arglist_;
    std::__cxx11::string::string((string *)&local_168,"ifaces_[i]->",(allocator *)&local_128);
    std::operator+(&local_1b0,&local_168,&(*pptVar7)->name_);
    std::operator+(&call,&local_1b0,"(");
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_168);
    bVar4 = is_complex_type(this,(*pptVar7)->returntype_);
    if (bVar4) {
      std::__cxx11::string::append((char *)&call);
    }
    bVar4 = !bVar4;
    for (pptVar8 = (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pptVar8 !=
        (ptVar3->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
      if (!bVar4) {
        std::__cxx11::string::append((char *)&call);
      }
      std::__cxx11::string::append((string *)&call);
      bVar4 = false;
    }
    std::__cxx11::string::append((char *)&call);
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    tfunction = *pptVar7;
    std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_128);
    std::__cxx11::string::string((string *)&local_50,"",(allocator *)&local_b0);
    function_signature(&local_168,this,tfunction,&local_90,&local_50,true);
    poVar6 = std::operator<<(poVar6,(string *)&local_168);
    poVar6 = std::operator<<(poVar6," override {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,"size_t sz = ifaces_.size();");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_168);
    poVar6 = std::operator<<(poVar6,"size_t i = 0;");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_128,(t_generator *)this);
    poVar6 = std::operator<<(poVar6,(string *)&local_128);
    poVar6 = std::operator<<(poVar6,"for (; i < (sz - 1); ++i) {");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,(string *)&call);
    poVar6 = std::operator<<(poVar6,";");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,"}");
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    iVar5 = (*((*pptVar7)->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar5 == '\0') {
      bVar4 = is_complex_type(this,(*pptVar7)->returntype_);
      if (bVar4) {
        t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
        poVar6 = std::operator<<(poVar6,(string *)&call);
        poVar6 = std::operator<<(poVar6,";");
        poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        t_generator::indent_abi_cxx11_(&local_168,(t_generator *)this);
        poVar6 = std::operator<<(poVar6,(string *)&local_168);
        poVar6 = std::operator<<(poVar6,"return;");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_168);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
        poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
        poVar6 = std::operator<<(poVar6,"return ");
        poVar6 = std::operator<<(poVar6,(string *)&call);
        poVar6 = std::operator<<(poVar6,";");
        std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
      poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
      poVar6 = std::operator<<(poVar6,(string *)&call);
      poVar6 = std::operator<<(poVar6,";");
      std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_1b0);
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_1b0,(t_generator *)this);
    poVar6 = std::operator<<((ostream *)poVar1,(string *)&local_1b0);
    poVar6 = std::operator<<(poVar6,"}");
    poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&call);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&call,(t_generator *)this);
  poVar6 = std::operator<<((ostream *)poVar1,(string *)&call);
  poVar6 = std::operator<<(poVar6,"};");
  poVar6 = std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar6,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&call);
  std::__cxx11::string::~string((string *)&list_type);
  std::__cxx11::string::~string((string *)&extends_multiface);
  std::__cxx11::string::~string((string *)&extends);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  return;
}

Assistant:

void t_cpp_generator::generate_service_multiface(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_multiface = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_multiface = ", public " + extends + "Multiface";
  }

  string list_type = string("std::vector<std::shared_ptr<") + service_name_ + "If> >";

  // Generate the header portion
  f_header_ << "class " << service_name_ << "Multiface : "
            << "virtual public " << service_name_ << "If" << extends_multiface << " {" << endl
            << " public:" << endl;
  indent_up();
  f_header_ << indent() << service_name_ << "Multiface(" << list_type
            << "& ifaces) : ifaces_(ifaces) {" << endl;
  if (!extends.empty()) {
    f_header_ << indent()
              << "  std::vector<std::shared_ptr<" + service_name_ + "If> >::iterator iter;"
              << endl << indent() << "  for (iter = ifaces.begin(); iter != ifaces.end(); ++iter) {"
              << endl << indent() << "    " << extends << "Multiface::add(*iter);" << endl
              << indent() << "  }" << endl;
  }
  f_header_ << indent() << "}" << endl << indent() << "virtual ~" << service_name_
            << "Multiface() {}" << endl;
  indent_down();

  // Protected data members
  f_header_ << " protected:" << endl;
  indent_up();
  f_header_ << indent() << list_type << " ifaces_;" << endl << indent() << service_name_
            << "Multiface() {}" << endl << indent() << "void add(::std::shared_ptr<"
            << service_name_ << "If> iface) {" << endl;
  if (!extends.empty()) {
    f_header_ << indent() << "  " << extends << "Multiface::add(iface);" << endl;
  }
  f_header_ << indent() << "  ifaces_.push_back(iface);" << endl << indent() << "}" << endl;
  indent_down();

  f_header_ << indent() << " public:" << endl;
  indent_up();

  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_java_doc(f_header_, *f_iter);
    t_struct* arglist = (*f_iter)->get_arglist();
    const vector<t_field*>& args = arglist->get_members();
    vector<t_field*>::const_iterator a_iter;

    string call = string("ifaces_[i]->") + (*f_iter)->get_name() + "(";
    bool first = true;
    if (is_complex_type((*f_iter)->get_returntype())) {
      call += "_return";
      first = false;
    }
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      if (first) {
        first = false;
      } else {
        call += ", ";
      }
      call += (*a_iter)->get_name();
    }
    call += ")";

    f_header_ << indent() << function_signature(*f_iter, "") << " override {" << endl;
    indent_up();
    f_header_ << indent() << "size_t sz = ifaces_.size();" << endl << indent() << "size_t i = 0;"
              << endl << indent() << "for (; i < (sz - 1); ++i) {" << endl;
    indent_up();
    f_header_ << indent() << call << ";" << endl;
    indent_down();
    f_header_ << indent() << "}" << endl;

    if (!(*f_iter)->get_returntype()->is_void()) {
      if (is_complex_type((*f_iter)->get_returntype())) {
        f_header_ << indent() << call << ";" << endl << indent() << "return;" << endl;
      } else {
        f_header_ << indent() << "return " << call << ";" << endl;
      }
    } else {
      f_header_ << indent() << call << ";" << endl;
    }

    indent_down();
    f_header_ << indent() << "}" << endl << endl;
  }

  indent_down();
  f_header_ << indent() << "};" << endl << endl;
}